

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log10f.h
# Opt level: O2

float log10f_4(float x)

{
  uint uVar1;
  anon_union_4_2_947300a4 ux1;
  float fVar2;
  
  uVar1 = (uint)(((uint)x >> 0x16 & 1) == 0);
  fVar2 = (float)(((uint)x & 0x7fffff) + uVar1 * 0x800000 + 0x3f000000) + -1.0;
  return (((fVar2 * 0.338531 + -0.741619) * fVar2 + 1.445866) * fVar2 +
         (float)(int)((((uint)x >> 0x17 & 0xff) - uVar1) + -0x7e)) * 0.30103;
}

Assistant:

float log10f_4(float x)
{
    const float a = 0.338531;
    const float b = -0.741619;
    const float c = 1.445866;
#define FNM fexp + (((a * signif) + b) * signif + c) * signif

    float signif, fexp;
    int exp;
    float lg2;
    union
    {
        float f;
        unsigned int i;
    } ux1, ux2;
    int greater; // really a boolean
    /* 
     * Assume IEEE representation, which is sgn(1):exp(8):frac(23)
     * representing (1+frac)*2^(exp-127).  Call 1+frac the significand
     */

    // get exponent
    ux1.f = x;
    exp = (ux1.i & 0x7F800000) >> 23;
    // actual exponent is exp-127, will subtract 127 later

    greater = ux1.i & 0x00400000; // true if signif > 1.5
    if (greater)
    {
        // signif >= 1.5 so need to divide by 2.  Accomplish this by
        // stuffing exp = 126 which corresponds to an exponent of -1
        ux2.i = (ux1.i & 0x007FFFFF) | 0x3f000000;
        signif = ux2.f;
        fexp = exp - 126; // 126 instead of 127 compensates for division by 2
        signif = signif - 1.0;
        lg2 = FNM;
    }
    else
    {
        // get signif by stuffing exp = 127 which corresponds to an exponent of 0
        ux2.i = (ux1.i & 0x007FFFFF) | 0x3f800000;
        signif = ux2.f;
        fexp = exp - 127;
        signif = signif - 1.0;
        lg2 = FNM;
    }
    // last two lines of each branch are common code, but optimize better
    //  when duplicated, at least when using gcc
    return lg2 * ONE_OVER_LOG2_10;
}